

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O3

void __thiscall
DRAG<TTA>::PerformLabelingMem
          (DRAG<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar5;
  Mat1b *pMVar6;
  long lVar7;
  long lVar8;
  pointer puVar9;
  pointer puVar10;
  int iVar11;
  pointer puVar12;
  pointer piVar13;
  DRAG<TTA> *pDVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  double dVar33;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_2d0 [104];
  Mat local_268 [16];
  long local_258;
  long *local_220;
  long local_208;
  DRAG<TTA> *local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  undefined1 local_1d8 [104];
  Mat local_170 [16];
  long local_160;
  long *local_128;
  Size local_110;
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1d8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110.height = (int)uVar2;
  local_110.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2d0,&local_110,0);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::MemAlloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar17 = *(uint *)&pMVar6->field_0x8;
  iVar24 = *(int *)&pMVar6->field_0xc;
  local_200 = this;
  if (0 < iVar24) {
    iVar16 = 0;
    lVar27 = local_1d8._24_8_;
    lVar28 = local_160;
    do {
      lVar31 = (long)iVar16;
      piVar1 = (int *)(lVar28 + lVar31 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar27 + lVar31) != '\0') {
        uVar15 = TTA::MemNewLabel();
        piVar1 = (int *)(local_258 + lVar31 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2d0._24_8_ + lVar31 * 4) = uVar15;
        lVar31 = lVar31 + 1;
        if (iVar24 <= (int)lVar31) break;
        lVar27 = 0;
        while( true ) {
          piVar1 = (int *)(local_160 + lVar31 * 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1d8._24_8_ + lVar31 + lVar27) == '\0') break;
          lVar28 = (long)(iVar16 + (int)lVar27);
          piVar1 = (int *)(local_258 + lVar28 * 4);
          *piVar1 = *piVar1 + 1;
          uVar5 = *(undefined4 *)(local_2d0._24_8_ + lVar28 * 4);
          piVar1 = (int *)(local_258 + lVar31 * 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2d0._24_8_ + lVar31 * 4 + lVar27 * 4) = uVar5;
          lVar27 = lVar27 + 1;
          if ((1 - iVar24) + iVar16 + (int)lVar27 == 0) goto LAB_00120464;
        }
        iVar16 = iVar16 + (int)lVar27 + 1;
        lVar27 = local_1d8._24_8_;
        lVar28 = local_160;
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 < iVar24);
  }
LAB_00120464:
  if (1 < (int)uVar17) {
    iVar24 = iVar24 + -1;
    lVar27 = (long)iVar24;
    local_1e8 = lVar27 + -1;
    local_1f0 = -lVar27;
    uVar21 = 1;
    lVar28 = 0;
    do {
      lVar31 = *local_128;
      piVar1 = (int *)(local_160 + lVar31 * uVar21);
      *piVar1 = *piVar1 + 1;
      lVar30 = *(long *)local_1d8._80_8_;
      cVar3 = *(char *)(local_1d8._24_8_ + lVar30 * uVar21);
      if (iVar24 == 0) {
        if (cVar3 != '\0') {
          lVar18 = uVar21 - 1;
          piVar1 = (int *)(local_160 + lVar31 * lVar18);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1d8._24_8_ + lVar30 * lVar18) == '\0') {
            uVar15 = TTA::MemNewLabel();
            piVar1 = (int *)(local_258 + *local_220 * uVar21);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2d0._24_8_ + *(long *)local_2d0._80_8_ * uVar21) = uVar15;
          }
          else {
            lVar31 = *local_220;
            piVar1 = (int *)(local_258 + lVar31 * lVar18);
            *piVar1 = *piVar1 + 1;
            lVar30 = *(long *)local_2d0._80_8_;
            uVar5 = *(undefined4 *)(local_2d0._24_8_ + lVar18 * lVar30);
            piVar1 = (int *)(local_258 + lVar31 * uVar21);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2d0._24_8_ + lVar30 * uVar21) = uVar5;
          }
        }
      }
      else {
        lVar18 = lVar27;
        if (cVar3 == '\0') {
          uVar25 = 0;
          goto LAB_001205cc;
        }
        lVar19 = uVar21 - 1;
        piVar1 = (int *)(local_160 + lVar31 * lVar19);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_1d8._24_8_ + lVar30 * lVar19) == '\0') {
          piVar1 = (int *)(local_160 + 4 + lVar31 * lVar19);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1d8._24_8_ + 1 + lVar30 * lVar19) == '\0') {
            uVar15 = TTA::MemNewLabel();
            piVar1 = (int *)(local_258 + *local_220 * uVar21);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2d0._24_8_ + *(long *)local_2d0._80_8_ * uVar21) = uVar15;
            iVar16 = 0;
            goto LAB_00120b66;
          }
          lVar31 = *local_220;
          piVar1 = (int *)(local_258 + 4 + lVar31 * lVar19);
          *piVar1 = *piVar1 + 1;
          lVar30 = *(long *)local_2d0._80_8_;
          uVar5 = *(undefined4 *)(local_2d0._24_8_ + 4 + lVar19 * lVar30);
          piVar1 = (int *)(local_258 + lVar31 * uVar21);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2d0._24_8_ + lVar30 * uVar21) = uVar5;
          uVar25 = 0;
          goto LAB_00120de5;
        }
        lVar31 = *local_220;
        piVar1 = (int *)(local_258 + lVar31 * lVar19);
        *piVar1 = *piVar1 + 1;
        lVar30 = *(long *)local_2d0._80_8_;
        uVar5 = *(undefined4 *)(local_2d0._24_8_ + lVar19 * lVar30);
        piVar1 = (int *)(local_258 + lVar31 * uVar21);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2d0._24_8_ + lVar30 * uVar21) = uVar5;
        uVar25 = 0;
LAB_00120e8a:
        iVar16 = (int)uVar25;
        if (iVar16 + 1 < iVar24) {
          lVar30 = *local_128;
          lVar19 = *(long *)local_1d8._80_8_;
          local_1f8 = uVar21 - 1;
          local_208 = lVar30 * local_1f8 + local_160;
          local_1e0 = lVar19 * local_1f8 + local_1d8._24_8_;
          lVar29 = (long)iVar16;
          lVar31 = local_2d0._24_8_ + 4 + lVar29 * 4;
          lVar32 = local_258 + lVar29 * 4 + 4;
          lVar22 = 0;
          while( true ) {
            piVar1 = (int *)(lVar30 * uVar21 + lVar29 * 4 + local_160 + 4 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar19 * uVar21 + lVar29 + local_1d8._24_8_ + 1 + lVar22) == '\0') {
              uVar25 = (ulong)(uint)((int)(lVar29 + 1) + (int)lVar22);
              goto LAB_001205cc;
            }
            piVar1 = (int *)(local_160 + lVar30 * lVar28 + lVar29 * 4 + 4 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1d8._24_8_ + lVar19 * lVar28 + lVar29 + 1 + lVar22) == '\0') break;
            lVar26 = *local_220;
            piVar1 = (int *)(lVar28 * lVar26 + lVar32 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            lVar23 = *(long *)local_2d0._80_8_;
            uVar5 = *(undefined4 *)(lVar28 * lVar23 + lVar31 + lVar22 * 4);
            piVar1 = (int *)(lVar26 * uVar21 + lVar32 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar23 * uVar21 + lVar31 + lVar22 * 4) = uVar5;
            lVar22 = lVar22 + 1;
            if (local_1f0 + lVar29 + 1 + lVar22 == 0) {
              iVar16 = iVar16 + (int)lVar22;
              goto LAB_00121007;
            }
          }
          iVar11 = iVar16 + (int)lVar22;
          lVar19 = (long)(iVar11 + 2);
          piVar1 = (int *)(local_208 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          uVar25 = lVar29 + 1 + lVar22;
          iVar16 = (int)uVar25;
          cVar3 = *(char *)(local_1e0 + lVar19);
          lVar31 = *local_220;
          lVar32 = lVar31 * uVar21 + local_258;
          piVar1 = (int *)(lVar32 + (long)iVar11 * 4);
          *piVar1 = *piVar1 + 1;
          lVar30 = *(long *)local_2d0._80_8_;
          lVar26 = lVar30 * uVar21 + local_2d0._24_8_;
          uVar15 = *(uint *)(lVar26 + (long)iVar11 * 4);
          if (cVar3 == '\0') {
            piVar1 = (int *)(lVar32 + lVar29 * 4 + 4 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(lVar26 + lVar29 * 4 + 4 + lVar22 * 4) = uVar15;
            goto LAB_00120b66;
          }
          piVar1 = (int *)(local_258 + lVar31 * local_1f8 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          uVar15 = TTA::MemMerge(uVar15,*(uint *)(local_2d0._24_8_ + lVar30 * local_1f8 + lVar19 * 4
                                                 ));
          piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar29 * 4 + 4 + lVar22 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar29 * 4 + 4 +
                   lVar22 * 4) = uVar15;
LAB_00120de5:
          do {
            lVar31 = (long)(int)uVar25;
            piVar1 = (int *)(*local_128 * uVar21 + local_160 + 4 + lVar31 * 4);
            *piVar1 = *piVar1 + 1;
            uVar25 = lVar31 + 1;
            cVar3 = *(char *)(lVar31 + 1 + *(long *)local_1d8._80_8_ * uVar21 + local_1d8._24_8_);
            if (iVar24 <= (int)uVar25) {
              if (cVar3 != '\0') {
                lVar30 = *local_220;
                piVar1 = (int *)(lVar30 * (uVar21 - 1) + local_258 + 4 + lVar31 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)local_2d0._80_8_;
                uVar5 = *(undefined4 *)((uVar21 - 1) * lVar18 + local_2d0._24_8_ + 4 + lVar31 * 4);
                piVar1 = (int *)(lVar30 * uVar21 + local_258 + 4 + lVar31 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar18 * uVar21 + local_2d0._24_8_ + 4 + lVar31 * 4) = uVar5;
              }
              goto LAB_0012126e;
            }
            if (cVar3 != '\0') {
              lVar30 = *local_220;
              piVar1 = (int *)(lVar30 * (uVar21 - 1) + local_258 + 4 + lVar31 * 4);
              *piVar1 = *piVar1 + 1;
              lVar19 = *(long *)local_2d0._80_8_;
              uVar5 = *(undefined4 *)((uVar21 - 1) * lVar19 + local_2d0._24_8_ + 4 + lVar31 * 4);
              piVar1 = (int *)(lVar30 * uVar21 + local_258 + 4 + lVar31 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar19 * uVar21 + local_2d0._24_8_ + 4 + lVar31 * 4) = uVar5;
              goto LAB_00120e8a;
            }
LAB_001205cc:
            while( true ) {
              lVar22 = (long)(int)uVar25;
              lVar31 = local_160 + lVar22 * 4;
              lVar30 = lVar22 << 0x20;
              lVar19 = 0;
              do {
                lVar29 = lVar30;
                lVar32 = lVar29 >> 0x20;
                if (lVar27 <= lVar19 + lVar22 + 1) {
                  lVar31 = *local_128;
                  lVar18 = lVar29 + 0x100000000 >> 0x20;
                  piVar1 = (int *)((lVar29 + 0x100000000 >> 0x1e) + lVar31 * uVar21 + local_160);
                  *piVar1 = *piVar1 + 1;
                  lVar30 = *(long *)local_1d8._80_8_;
                  if (*(char *)(lVar18 + lVar30 * uVar21 + local_1d8._24_8_) != '\0') {
                    lVar19 = uVar21 - 1;
                    lVar31 = local_160 + lVar31 * lVar19;
                    piVar1 = (int *)(lVar31 + lVar18 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar30 = local_1d8._24_8_ + lVar30 * lVar19;
                    if (*(char *)(lVar18 + lVar30) == '\0') {
                      piVar1 = (int *)(lVar31 + (lVar29 >> 0x1e));
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar30 + lVar32) == '\0') {
                        uVar15 = TTA::MemNewLabel();
                        piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar18 * 4);
                        *piVar1 = *piVar1 + 1;
                        *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar18 * 4
                                 ) = uVar15;
                      }
                      else {
                        lVar31 = *local_220;
                        piVar1 = (int *)(lVar31 * lVar19 + local_258 + lVar32 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar30 = *(long *)local_2d0._80_8_;
                        uVar5 = *(undefined4 *)(lVar19 * lVar30 + local_2d0._24_8_ + lVar32 * 4);
                        piVar1 = (int *)(lVar31 * uVar21 + local_258 + lVar18 * 4);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)(lVar30 * uVar21 + local_2d0._24_8_ + lVar18 * 4) = uVar5;
                      }
                    }
                    else {
                      lVar31 = *local_220;
                      piVar1 = (int *)(lVar31 * lVar19 + local_258 + lVar18 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar30 = *(long *)local_2d0._80_8_;
                      uVar5 = *(undefined4 *)(lVar19 * lVar30 + local_2d0._24_8_ + lVar18 * 4);
                      piVar1 = (int *)(lVar31 * uVar21 + local_258 + lVar18 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)(lVar30 * uVar21 + local_2d0._24_8_ + lVar18 * 4) = uVar5;
                    }
                  }
                  goto LAB_0012126e;
                }
                lVar7 = *local_128;
                piVar1 = (int *)(uVar21 * lVar7 + lVar31 + 4 + lVar19 * 4);
                *piVar1 = *piVar1 + 1;
                lVar8 = *(long *)local_1d8._80_8_;
                lVar26 = lVar19 + 1;
                lVar23 = lVar19 + 1;
                lVar30 = lVar29 + 0x100000000;
                lVar19 = lVar26;
              } while (*(char *)(lVar23 + uVar21 * lVar8 + local_1d8._24_8_ + lVar22) == '\0');
              uVar25 = (uVar25 & 0xffffffff) + lVar26;
              piVar1 = (int *)(lVar31 + lVar28 * lVar7 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar26 + local_1d8._24_8_ + lVar22 + lVar28 * lVar8) != '\0') {
                lVar31 = *local_220;
                piVar1 = (int *)(lVar31 * lVar28 + local_258 + lVar22 * 4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                lVar30 = *(long *)local_2d0._80_8_;
                uVar5 = *(undefined4 *)
                         (lVar30 * lVar28 + local_2d0._24_8_ + lVar22 * 4 + lVar26 * 4);
                piVar1 = (int *)(lVar31 * uVar21 + local_258 + lVar22 * 4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar30 * uVar21 + local_2d0._24_8_ + lVar22 * 4 + lVar26 * 4) =
                     uVar5;
                goto LAB_00120e8a;
              }
              lVar31 = uVar21 - 1;
              lVar19 = local_160 + lVar7 * lVar31;
              lVar30 = local_1d8._24_8_ + lVar8 * lVar31;
              piVar1 = (int *)(lVar19 + (lVar29 + 0x200000000 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              lVar23 = lVar29 + 0x200000000 >> 0x20;
              cVar3 = *(char *)(lVar30 + lVar23);
              piVar1 = (int *)(lVar19 + (lVar29 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              cVar4 = *(char *)(lVar30 + lVar32);
              if (cVar3 != '\0') break;
              if (cVar4 == '\0') {
                uVar15 = TTA::MemNewLabel();
                piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar22 * 4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar22 * 4 +
                         lVar26 * 4) = uVar15;
              }
              else {
                lVar30 = *local_220;
                piVar1 = (int *)(lVar30 * lVar31 + local_258 + lVar32 * 4);
                *piVar1 = *piVar1 + 1;
                lVar19 = *(long *)local_2d0._80_8_;
                uVar5 = *(undefined4 *)(lVar31 * lVar19 + local_2d0._24_8_ + lVar32 * 4);
                piVar1 = (int *)(lVar30 * uVar21 + local_258 + lVar22 * 4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar19 * uVar21 + local_2d0._24_8_ + lVar22 * 4 + lVar26 * 4) =
                     uVar5;
              }
              iVar16 = (int)uVar25;
LAB_00120b66:
              if (iVar24 <= iVar16 + 1) {
                lVar18 = (long)(iVar16 + 1);
LAB_00120cb1:
                piVar1 = (int *)(*local_128 * uVar21 + local_160 + lVar18 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar18 + *(long *)local_1d8._80_8_ * uVar21 + local_1d8._24_8_) ==
                    '\0') goto LAB_0012126e;
                lVar31 = *local_220 * uVar21 + local_258;
                goto LAB_0012124e;
              }
              lVar31 = *local_128;
              lVar30 = *(long *)local_1d8._80_8_;
              lVar22 = (long)iVar16;
              lVar19 = lVar22 << 0x20;
              lVar29 = 0;
              while( true ) {
                piVar1 = (int *)(local_160 + lVar31 * uVar21 + lVar22 * 4 + 4 + lVar29 * 4);
                *piVar1 = *piVar1 + 1;
                local_208 = lVar22;
                if (*(char *)(local_1d8._24_8_ + lVar30 * uVar21 + lVar22 + 1 + lVar29) == '\0')
                break;
                piVar1 = (int *)(lVar31 * lVar28 + lVar22 * 4 + local_160 + 8 + lVar29 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar30 * lVar28 + lVar22 + local_1d8._24_8_ + 2 + lVar29) != '\0') {
                  uVar25 = (ulong)(uint)(iVar16 + 1 + (int)lVar29);
                  lVar31 = *local_220;
                  piVar1 = (int *)((lVar19 >> 0x1e) + lVar31 * uVar21 + local_258);
                  *piVar1 = *piVar1 + 1;
                  lVar30 = *(long *)local_2d0._80_8_;
                  uVar15 = *(uint *)((lVar19 >> 0x1e) + lVar30 * uVar21 + local_2d0._24_8_);
                  piVar1 = (int *)(lVar31 * lVar28 + local_258 + lVar22 * 4 + 8 + lVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar30 * lVar28 + local_2d0._24_8_ +
                                                          lVar22 * 4 + 8 + lVar29 * 4));
                  piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar22 * 4 + 4 + lVar29 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar22 * 4 + 4 +
                           lVar29 * 4) = uVar15;
                  goto LAB_00120de5;
                }
                lVar26 = *local_220 * uVar21 + local_258 + lVar22 * 4 + 4;
                piVar1 = (int *)(lVar26 + -4 + lVar29 * 4);
                *piVar1 = *piVar1 + 1;
                lVar32 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar22 * 4 + 4;
                uVar5 = *(undefined4 *)(lVar32 + -4 + lVar29 * 4);
                piVar1 = (int *)(lVar26 + lVar29 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar32 + lVar29 * 4) = uVar5;
                lVar19 = lVar19 + 0x100000000;
                lVar29 = lVar29 + 1;
                if (local_1e8 - lVar22 == lVar29) {
                  iVar16 = iVar16 + (int)lVar29;
                  goto LAB_00120cb1;
                }
              }
              uVar25 = (ulong)(uint)(iVar16 + 1 + (int)lVar29);
            }
            lVar30 = *local_220;
            lVar19 = lVar30 * lVar31 + local_258;
            if (cVar4 == '\0') {
              piVar1 = (int *)(lVar19 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              lVar19 = *(long *)local_2d0._80_8_;
              uVar5 = *(undefined4 *)(lVar31 * lVar19 + local_2d0._24_8_ + lVar23 * 4);
              piVar1 = (int *)(local_258 + lVar30 * uVar21 + lVar22 * 4 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar19 * uVar21 + local_2d0._24_8_ + lVar22 * 4 + lVar26 * 4) = uVar5;
            }
            else {
              piVar1 = (int *)(lVar19 + lVar32 * 4);
              *piVar1 = *piVar1 + 1;
              lVar31 = lVar31 * *(long *)local_2d0._80_8_ + local_2d0._24_8_;
              uVar15 = *(uint *)(lVar31 + lVar32 * 4);
              piVar1 = (int *)(lVar19 + lVar23 * 4);
              *piVar1 = *piVar1 + 1;
              uVar15 = TTA::MemMerge(uVar15,*(uint *)(lVar31 + lVar23 * 4));
              piVar1 = (int *)(*local_220 * uVar21 + local_258 + lVar22 * 4 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_ + lVar22 * 4 +
                       lVar26 * 4) = uVar15;
            }
            uVar25 = uVar25 & 0xffffffff;
          } while( true );
        }
        lVar18 = (long)(iVar16 + 1);
LAB_00121007:
        lVar31 = *local_128;
        piVar1 = (int *)(lVar31 * uVar21 + local_160 + lVar18 * 4);
        *piVar1 = *piVar1 + 1;
        lVar30 = *(long *)local_1d8._80_8_;
        if (*(char *)(lVar18 + lVar30 * uVar21 + local_1d8._24_8_) != '\0') {
          lVar19 = uVar21 - 1;
          piVar1 = (int *)(local_160 + lVar31 * lVar19 + lVar18 * 4);
          *piVar1 = *piVar1 + 1;
          lVar31 = *local_220;
          if (*(char *)(lVar18 + local_1d8._24_8_ + lVar30 * lVar19) == '\0') {
            lVar31 = local_258 + lVar31 * uVar21;
LAB_0012124e:
            piVar1 = (int *)(lVar31 + (long)iVar16 * 4);
            *piVar1 = *piVar1 + 1;
            lVar30 = *(long *)local_2d0._80_8_ * uVar21 + local_2d0._24_8_;
            uVar5 = *(undefined4 *)(lVar30 + (long)iVar16 * 4);
            piVar1 = (int *)(lVar31 + lVar18 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar30 + lVar18 * 4) = uVar5;
          }
          else {
            piVar1 = (int *)(lVar31 * lVar19 + local_258 + lVar18 * 4);
            *piVar1 = *piVar1 + 1;
            lVar30 = *(long *)local_2d0._80_8_;
            uVar5 = *(undefined4 *)(lVar19 * lVar30 + local_2d0._24_8_ + lVar18 * 4);
            piVar1 = (int *)(lVar31 * uVar21 + local_258 + lVar18 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar30 * uVar21 + local_2d0._24_8_ + lVar18 * 4) = uVar5;
          }
        }
      }
LAB_0012126e:
      uVar21 = uVar21 + 1;
      lVar28 = lVar28 + 1;
    } while (uVar21 != uVar17);
  }
  uVar17 = TTA::MemFlatten();
  (local_200->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar17;
  piVar13 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar12 = TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)local_2d0._0_4_) {
    uVar21 = (ulong)(uint)local_2d0._4_4_;
    lVar27 = 0;
    do {
      if (0 < (int)uVar21) {
        lVar31 = *local_220 * lVar27 + local_258;
        lVar28 = *(long *)local_2d0._80_8_ * lVar27 + local_2d0._24_8_;
        lVar30 = 0;
        do {
          piVar1 = (int *)(lVar31 + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          iVar24 = *(int *)(lVar28 + lVar30 * 4);
          piVar13[iVar24] = piVar13[iVar24] + 1;
          uVar17 = puVar12[iVar24];
          piVar1 = (int *)(lVar31 + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar28 + lVar30 * 4) = uVar17;
          lVar30 = lVar30 + 1;
          uVar21 = (ulong)(int)local_2d0._4_4_;
        } while (lVar30 < (long)uVar21);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < (int)local_2d0._0_4_);
  }
  pauVar20 = (undefined1 (*) [16])operator_new(0x20);
  pauVar20[1] = (undefined1  [16])0x0;
  *pauVar20 = (undefined1  [16])0x0;
  puVar9 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar10 = (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar20;
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar20 + 2);
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar20 + 2);
  if (puVar9 != (pointer)0x0) {
    operator_delete(puVar9,(long)puVar10 - (long)puVar9);
  }
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_170;
  cv::sum((_InputArray *)&local_f0);
  pDVar14 = local_200;
  *(accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_f0._0_8_ - 9.223372036854776e+18) & (long)(double)local_f0._0_8_ >> 0x3f
       | (long)(double)local_f0._0_8_;
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_268;
  cv::sum((_InputArray *)&local_f0);
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(double)local_f0._0_8_ >> 0x3f & (long)((double)local_f0._0_8_ - 9.223372036854776e+18)
       | (long)(double)local_f0._0_8_;
  dVar33 = TTA::MemTotalAccesses();
  (accesses->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar33 >> 0x3f & (long)(dVar33 - 9.223372036854776e+18) | (long)dVar33;
  MemMat<int>::GetImage(&local_f0,(MemMat<int> *)local_2d0);
  cv::Mat::operator=(&((pDVar14->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                     ,&local_f0.super_Mat);
  cv::Mat::~Mat(&local_f0.super_Mat);
  cv::Mat::~Mat(local_268);
  cv::Mat::~Mat((Mat *)(local_2d0 + 8));
  cv::Mat::~Mat(local_170);
  cv::Mat::~Mat((Mat *)(local_1d8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {

        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0); 

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // First scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img(r,c)>0
#define CONDITION_P img(r-1,c-1)>0
#define CONDITION_Q img(r-1,c)>0
#define CONDITION_R img(r-1,c+1)>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels(r,c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r,c) = img_labels(r - 1, c - 1); // x <- p
#define ACTION_4 img_labels(r,c) = img_labels(r - 1, c); // x <- q
#define ACTION_5 img_labels(r,c) = img_labels(r - 1, c + 1); // x <- r
#define ACTION_6 img_labels(r,c) = img_labels(r, c - 1); // x <- s
#define ACTION_7 img_labels(r,c) = LabelsSolver::MemMerge(img_labels(r - 1, c - 1), img_labels(r - 1, c + 1)); // x <- p + r
#define ACTION_8 img_labels(r,c) = LabelsSolver::MemMerge(img_labels(r, c - 1), img_labels(r - 1, c + 1)); // x <- s + r

#define COLS w

        {
            int r = 0; 
#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows' for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels.rows; ++r_i) {
            for (int c_i = 0; c_i < img_labels.cols; ++c_i) {
                img_labels(r_i, c_i) = LabelsSolver::MemGetLabel(img_labels(r_i, c_i));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage(); 

        LabelsSolver::MemDealloc();
    }